

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QMap<QString,_QMatchData> * __thiscall
QMap<QModelIndex,_QMap<QString,_QMatchData>_>::operator[]
          (QMap<QModelIndex,_QMap<QString,_QMatchData>_> *this,QModelIndex *key)

{
  bool bVar1;
  pointer ppVar2;
  pair<const_QModelIndex,_QMap<QString,_QMatchData>_> *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>,_bool>
  pVar3;
  iterator i;
  QMap<QModelIndex,_QMap<QString,_QMatchData>_> copy;
  QModelIndex *in_stack_ffffffffffffff58;
  QMap<QString,_QMatchData> *pQVar4;
  QMap<QModelIndex,_QMap<QString,_QMatchData>_> *in_stack_ffffffffffffff60;
  map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>
  *this_00;
  map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>
  local_58;
  _Self local_28;
  undefined1 *local_20;
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff60->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffff60,
         (QMap<QModelIndex,_QMap<QString,_QMatchData>_> *)in_stack_ffffffffffffff58);
  }
  else {
    memset(&local_20,0,8);
    QMap((QMap<QModelIndex,_QMap<QString,_QMatchData>_> *)0xa71b6f);
  }
  detach(in_stack_ffffffffffffff60);
  local_28._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>_>
                *)0xa71b92);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>
       ::find((map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>
               *)in_stack_ffffffffffffff58,(key_type *)0xa71ba3);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>_>
                *)0xa71bb5);
  local_58._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::
               map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>
               ::end((map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>
                      *)in_stack_ffffffffffffff58);
  bVar1 = std::operator==(&local_28,
                          (_Self *)&local_58._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar1) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>_>
                  *)0xa71beb);
    local_58._M_t._M_impl._0_8_ = 0;
    this_00 = &local_58;
    QMap<QString,_QMatchData>::QMap((QMap<QString,_QMatchData> *)0xa71c16);
    std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>::pair<QMap<QString,_QMatchData>,_true>
              (in_RSI,in_stack_ffffffffffffff58,(QMap<QString,_QMatchData> *)0xa71c2f);
    pVar3 = std::
            map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>
            ::insert(this_00,in_RSI);
    local_28._M_node = (_Base_ptr)pVar3.first._M_node;
    local_10 = pVar3.second;
    local_18 = local_28._M_node;
    std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>::~pair
              ((pair<const_QModelIndex,_QMap<QString,_QMatchData>_> *)0xa71c79);
    QMap<QString,_QMatchData>::~QMap((QMap<QString,_QMatchData> *)0xa71c83);
  }
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>::
           operator->((_Rb_tree_iterator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>
                       *)0xa71c90);
  pQVar4 = &ppVar2->second;
  ~QMap((QMap<QModelIndex,_QMap<QString,_QMatchData>_> *)0xa71ca5);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }